

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

String * __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::buildLayout
          (String *__return_storage_ptr__,ShaderStorageBufferLayoutBindingCase *this,String *binding
          )

{
  ostringstream *this_00;
  long lVar1;
  char *pcVar2;
  ostringstream s;
  undefined1 local_190 [376];
  
  this_00 = (ostringstream *)local_190;
  std::__cxx11::ostringstream::ostringstream(this_00);
  if (binding->_M_string_length == 0) {
    lVar1 = 0xf;
    pcVar2 = "layout(std430) ";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"layout(binding=",0xf);
    this_00 = (ostringstream *)
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_190,(binding->_M_dataplus)._M_p,binding->_M_string_length)
    ;
    lVar1 = 10;
    pcVar2 = ", std430) ";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar2,lVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

String buildLayout(const String& binding)
	{
		std::ostringstream s;
		if (!binding.empty())
			s << "layout(binding=" << binding << ", std430) ";
		else
			s << "layout(std430) ";
		return s.str();
	}